

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qprogressdialog.cpp
# Opt level: O2

void QProgressDialog::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  int *piVar1;
  qsizetype qVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  undefined1 uVar5;
  int iVar6;
  QString *text;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        canceled((QProgressDialog *)_o);
        return;
      }
      break;
    case 1:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        cancel((QProgressDialog *)_o);
        return;
      }
      break;
    case 2:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        reset((QProgressDialog *)_o);
        return;
      }
      break;
    case 3:
      iVar6 = *_a[1];
LAB_004bff0c:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setMaximum((QProgressDialog *)_o,iVar6);
        return;
      }
      break;
    case 4:
      iVar6 = *_a[1];
LAB_004bfe97:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setMinimum((QProgressDialog *)_o,iVar6);
        return;
      }
      break;
    case 5:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setRange((QProgressDialog *)_o,*_a[1],*_a[2]);
        return;
      }
      break;
    case 6:
      iVar6 = *_a[1];
LAB_004bffaa:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setValue((QProgressDialog *)_o,iVar6);
        return;
      }
      break;
    case 7:
      text = (QString *)_a[1];
switchD_004bfd31_caseD_7:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setLabelText((QProgressDialog *)_o,text);
        return;
      }
      break;
    case 8:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setCancelButtonText((QProgressDialog *)_o,(QString *)_a[1]);
        return;
      }
      break;
    case 9:
      iVar6 = *_a[1];
LAB_004bfec0:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setMinimumDuration((QProgressDialog *)_o,iVar6);
        return;
      }
      break;
    case 10:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        forceShow((QProgressDialog *)_o);
        return;
      }
      break;
    case 0xb:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QProgressDialogPrivate::_q_disconnectOnClose(*(QProgressDialogPrivate **)(_o + 8));
        return;
      }
      break;
    default:
      goto switchD_004bfcd3_caseD_3;
    }
    goto LAB_004c000b;
  case ReadProperty:
    if (7 < (uint)_id) goto switchD_004bfcd3_caseD_3;
    break;
  case WriteProperty:
    if (_id - 1U < 7) {
      text = (QString *)*_a;
      switch(_id) {
      case 1:
        iVar6 = *(int *)&(text->d).d;
        goto LAB_004bfe97;
      case 2:
        iVar6 = *(int *)&(text->d).d;
        goto LAB_004bff0c;
      case 3:
        iVar6 = *(int *)&(text->d).d;
        goto LAB_004bffaa;
      case 4:
        *(undefined1 *)(*(long *)(_o + 8) + 0x34b) = *(undefined1 *)&(text->d).d;
        break;
      case 5:
        *(undefined1 *)(*(long *)(_o + 8) + 0x34a) = *(undefined1 *)&(text->d).d;
        break;
      case 6:
        iVar6 = *(int *)&(text->d).d;
        goto LAB_004bfec0;
      case 7:
        goto switchD_004bfd31_caseD_7;
      }
    }
  default:
    goto switchD_004bfcd3_caseD_3;
  case IndexOfMethod:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      QtMocHelpers::indexOfMethod<void(QProgressDialog::*)()>
                ((QtMocHelpers *)_a,(void **)canceled,0,0);
      return;
    }
    goto LAB_004c000b;
  }
  piVar1 = (int *)*_a;
  switch(_id) {
  case 0:
    uVar5 = *(undefined1 *)(*(long *)(_o + 8) + 0x34d);
    goto LAB_004bfe3f;
  case 1:
    iVar6 = minimum((QProgressDialog *)_o);
    break;
  case 2:
    iVar6 = maximum((QProgressDialog *)_o);
    break;
  case 3:
    iVar6 = value((QProgressDialog *)_o);
    break;
  case 4:
    uVar5 = *(undefined1 *)(*(long *)(_o + 8) + 0x34b);
    goto LAB_004bfe3f;
  case 5:
    uVar5 = *(undefined1 *)(*(long *)(_o + 8) + 0x34a);
LAB_004bfe3f:
    *(undefined1 *)piVar1 = uVar5;
    goto switchD_004bfcd3_caseD_3;
  case 6:
    iVar6 = *(int *)(*(long *)(_o + 8) + 0x340);
    break;
  case 7:
    labelText((QString *)&local_38,(QProgressDialog *)_o);
    pDVar3 = *(Data **)piVar1;
    pcVar4 = *(char16_t **)(piVar1 + 2);
    *(Data **)piVar1 = local_38.d;
    *(char16_t **)(piVar1 + 2) = local_38.ptr;
    qVar2 = *(qsizetype *)(piVar1 + 4);
    *(qsizetype *)(piVar1 + 4) = local_38.size;
    local_38.d = pDVar3;
    local_38.ptr = pcVar4;
    local_38.size = qVar2;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
    goto switchD_004bfcd3_caseD_3;
  }
  *piVar1 = iVar6;
switchD_004bfcd3_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_004c000b:
  __stack_chk_fail();
}

Assistant:

void QProgressDialog::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QProgressDialog *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->canceled(); break;
        case 1: _t->cancel(); break;
        case 2: _t->reset(); break;
        case 3: _t->setMaximum((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 4: _t->setMinimum((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 5: _t->setRange((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 6: _t->setValue((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 7: _t->setLabelText((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 8: _t->setCancelButtonText((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 9: _t->setMinimumDuration((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 10: _t->forceShow(); break;
        case 11: _t->d_func()->_q_disconnectOnClose(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QProgressDialog::*)()>(_a, &QProgressDialog::canceled, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->wasCanceled(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->minimum(); break;
        case 2: *reinterpret_cast<int*>(_v) = _t->maximum(); break;
        case 3: *reinterpret_cast<int*>(_v) = _t->value(); break;
        case 4: *reinterpret_cast<bool*>(_v) = _t->autoReset(); break;
        case 5: *reinterpret_cast<bool*>(_v) = _t->autoClose(); break;
        case 6: *reinterpret_cast<int*>(_v) = _t->minimumDuration(); break;
        case 7: *reinterpret_cast<QString*>(_v) = _t->labelText(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 1: _t->setMinimum(*reinterpret_cast<int*>(_v)); break;
        case 2: _t->setMaximum(*reinterpret_cast<int*>(_v)); break;
        case 3: _t->setValue(*reinterpret_cast<int*>(_v)); break;
        case 4: _t->setAutoReset(*reinterpret_cast<bool*>(_v)); break;
        case 5: _t->setAutoClose(*reinterpret_cast<bool*>(_v)); break;
        case 6: _t->setMinimumDuration(*reinterpret_cast<int*>(_v)); break;
        case 7: _t->setLabelText(*reinterpret_cast<QString*>(_v)); break;
        default: break;
        }
    }
}